

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextRegionCommentDoc(Lexer *this)

{
  Lexer *in_RSI;
  char cVar1;
  undefined2 local_5a;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  local_58;
  undefined1 local_4c [28];
  
  nextChar(in_RSI);
  (in_RSI->lastComment)._M_string_length = 0;
  cVar1 = (char)in_RSI + -0x40;
  *(in_RSI->lastComment)._M_dataplus._M_p = '\0';
  while( true ) {
    while (in_RSI->currentChar == 0x2a) {
      nextChar(in_RSI);
      if (in_RSI->currentChar == 0x2f) {
        nextChar(in_RSI);
        nextToken(this);
        return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               this;
      }
      std::__cxx11::string::push_back(cVar1);
    }
    if (in_RSI->currentChar == -1) break;
    std::__cxx11::string::push_back(cVar1);
    nextChar(in_RSI);
  }
  local_5a = LEX_ERR_ID_NOT_JUST_ANYS;
  local_4c._0_4_ = 10;
  getCurrentCursor((Position *)(local_4c + 4),in_RSI);
  std::
  make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
            ((Level *)&local_58,(LexerErrorCode *)&local_5a,(Position *)local_4c);
  generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                      *)in_RSI);
  std::
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  ::~unique_ptr(&local_58);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextRegionCommentDoc() noexcept {
  nextChar();
  lastComment.clear();

  while (currentChar != EOF) {
    if (currentChar == '*') {
      nextChar(); // eat *
      if (currentChar == '/') {
        nextChar(); // eat /
        return nextToken();
      }

      lastComment += '*';
      continue;
    }

    lastComment += (char) currentChar;

    nextChar();
  }

  return generateError(std::make_unique<LexerError>(LVL_ERROR, LexerErrorCode::LEX_ERR_REGION_COMMENT_END,
    getCurrentCursor()));
}